

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::setAutoFillBackground(QWidget *this,bool enabled)

{
  QWidgetPrivate *this_00;
  QWidgetData *pQVar1;
  undefined1 auVar2 [16];
  QWExtra *pQVar3;
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  pQVar3 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (pQVar3 == (QWExtra *)0x0) {
    QWidgetPrivate::createExtra(this_00);
    pQVar3 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
             _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  }
  if (((*(ushort *)&pQVar3->field_0x7c & 0x10) == 0) != enabled) {
    return;
  }
  *(ushort *)&pQVar3->field_0x7c = *(ushort *)&pQVar3->field_0x7c & 0xffef | (ushort)enabled << 4;
  QWidgetPrivate::updateIsOpaque(this_00);
  pQVar1 = this->data;
  auVar2._4_4_ = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
  auVar2._0_4_ = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
  auVar2._8_8_ = 0;
  QWidgetPrivate::update<QRect>(*(QWidgetPrivate **)&this->field_0x8,(QRect)(auVar2 << 0x40));
  QWidgetPrivate::updateIsOpaque(this_00);
  return;
}

Assistant:

void QWidget::setAutoFillBackground(bool enabled)
{
    Q_D(QWidget);
    if (!d->extra)
        d->createExtra();
    if (d->extra->autoFillBackground == enabled)
        return;

    d->extra->autoFillBackground = enabled;
    d->updateIsOpaque();
    update();
    d->updateIsOpaque();
}